

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::NewCovergroupExpression::serializeTo
          (NewCovergroupExpression *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppEVar2;
  long lVar3;
  string_view name;
  
  name._M_str = "arguments";
  name._M_len = 9;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->arguments)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->arguments)._M_ptr;
    lVar3 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void NewCovergroupExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();
}